

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O0

string * __thiscall
inja::Parser::load_file_abi_cxx11_(string *__return_storage_ptr__,Parser *this,string_view filename)

{
  istreambuf_iterator<char,_std::char_traits<char>_> __beg;
  istreambuf_iterator<char,_std::char_traits<char>_> __end;
  allocator<char> local_281;
  undefined1 local_280 [12];
  undefined1 local_270 [12];
  undefined1 local_25d;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  istream_type local_230 [8];
  ifstream file;
  Parser *this_local;
  string_view filename_local;
  string *text;
  
  filename_local.data_ = (const_pointer)filename.size_;
  this_local = (Parser *)filename.data_;
  filename_local.size_ = (size_type)__return_storage_ptr__;
  nonstd::sv_lite::basic_string_view::operator_cast_to_string
            (&local_250,(basic_string_view *)&this_local);
  std::ifstream::ifstream(local_230,(string *)&local_250,_S_in);
  std::__cxx11::string::~string((string *)&local_250);
  local_25d = 0;
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_270,local_230);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_280);
  std::allocator<char>::allocator();
  __beg._12_4_ = 0;
  __beg._M_sbuf = (streambuf_type *)local_270._0_8_;
  __beg._M_c = local_270._8_4_;
  __end._12_4_ = 0;
  __end._M_sbuf = (streambuf_type *)local_280._0_8_;
  __end._M_c = local_280._8_4_;
  std::__cxx11::string::string<std::istreambuf_iterator<char,std::char_traits<char>>,void>
            ((string *)__return_storage_ptr__,__beg,__end,&local_281);
  std::allocator<char>::~allocator(&local_281);
  local_25d = 1;
  std::ifstream::~ifstream(local_230);
  return __return_storage_ptr__;
}

Assistant:

std::string load_file(nonstd::string_view filename) {
		std::ifstream file(static_cast<std::string>(filename));
		std::string text((std::istreambuf_iterator<char>(file)), std::istreambuf_iterator<char>());
		return text;
	}